

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O2

double __thiscall
Kriging::_logLikelihood
          (Kriging *this,vec *_theta,vec *grad_out,mat *hess_out,KModel *model,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *bench)

{
  uint in_n_rows;
  uint uVar1;
  double *pdVar2;
  result rVar3;
  elem_type eVar4;
  elem_type eVar5;
  result rVar6;
  int iVar7;
  time_point tVar8;
  Mat<double> *pMVar9;
  ulong uVar10;
  undefined8 extraout_RAX;
  uword uVar11;
  uword extraout_EDX;
  uword A_n_rows;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uword in_slice;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x_00;
  uword B_n_rows;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  mat H;
  mat gradR_l;
  mat gradR_k;
  cube gradR;
  mat hessR_k_l;
  mat xl;
  mat x;
  mat aux;
  mat Rinv;
  vec terme1;
  mat xk;
  vec zeros;
  KModel m;
  char *in_stack_ffffffffffffea38;
  double local_15a0;
  double local_1598;
  string local_1550;
  double local_1530;
  undefined1 local_1528 [8];
  undefined8 local_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  uword local_1508;
  uword uStack_1504;
  double local_1478;
  undefined1 local_1448 [8];
  undefined8 local_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  uword local_1428;
  uword uStack_1424;
  double local_1398;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> local_1360;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>
  local_1348;
  Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  local_1330;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>
  local_1318;
  Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans2>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  local_1300;
  string local_12e8;
  string local_12c8;
  string local_12a8;
  string local_1288;
  eGlue<arma::Mat<double>,_arma::eOp<arma::Mat<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  local_1268;
  undefined1 local_1248 [16];
  uword local_1238;
  uword local_1234;
  uword local_1230;
  double *local_1228;
  undefined1 local_1198 [24];
  double dStack_1180;
  uword local_1178;
  uword uStack_1174;
  undefined1 local_10e8 [32];
  double *local_10c8;
  string local_1038;
  string local_1018;
  string local_ff8;
  string local_fd8;
  string local_fb8;
  string local_f98;
  string local_f78;
  string local_f58;
  undefined8 local_f38;
  uword local_f2c;
  Mat<double> local_cb8;
  eOp<arma::Mat<double>,_arma::eop_scalar_times> local_c08;
  Op<arma::Mat<double>,_arma::op_htrans2> local_bc8;
  Mat<double> local_b88;
  mat local_ad8;
  Mat<double> local_a28;
  undefined1 local_978 [208];
  double local_8a8;
  Op<arma::Mat<double>,_arma::op_htrans> local_818;
  Mat<double> local_7d8;
  Mat<double> local_728;
  undefined1 local_678 [180];
  uint uStack_5c4;
  Cube<double> local_518;
  mat local_258;
  mat local_1a8;
  double local_f8;
  
  make_Model((KModel *)local_678,this,_theta,bench);
  if (model != (KModel *)0x0) {
    KModel::operator=(model,(KModel *)local_678);
  }
  in_n_rows = (this->m_X).n_rows;
  uVar15 = (ulong)in_n_rows;
  if (this->m_est_sigma2 == true) {
    local_15a0 = (double)uVar15;
    local_1598 = local_f8 / local_15a0;
    dVar26 = log(local_1598 * 6.283185307179586);
    uVar1 = local_678._176_4_;
    if (uStack_5c4 < (uint)local_678._176_4_) {
      uVar1 = uStack_5c4;
    }
    local_f38 = (diagview<double> *)local_1528;
    local_1520 = (Mat<double> *)0x0;
    local_1518 = (elem_type)CONCAT44(uVar1,uVar1);
    local_1528 = (undefined1  [8])(local_678 + 0xb0);
    rVar3 = arma::accu<arma::eOp<arma::diagview<double>,arma::eop_log>>
                      ((eOp<arma::diagview<double>,_arma::eop_log> *)&local_f38);
    local_15a0 = dVar26 * local_15a0 + rVar3 + rVar3 + local_15a0;
  }
  else {
    local_1598 = this->m_sigma2;
    dVar26 = log(local_1598 * 6.283185307179586);
    local_1448 = (undefined1  [8])(local_678 + 0xb0);
    local_1438._4_4_ = local_678._176_4_;
    if (uStack_5c4 < (uint)local_678._176_4_) {
      local_1438._4_4_ = uStack_5c4;
    }
    local_1528 = (undefined1  [8])local_1448;
    local_1440 = (mat *)0x0;
    local_1438._0_4_ = local_1438._4_4_;
    rVar3 = arma::accu<arma::eOp<arma::diagview<double>,arma::eop_log>>
                      ((eOp<arma::diagview<double>,_arma::eop_log> *)local_1528);
    LinearAlgebra::crossprod((mat *)&local_f38,&local_1a8);
    eVar4 = arma::as_scalar<arma::Mat<double>>((Base<double,_arma::Mat<double>_> *)&local_f38);
    local_15a0 = eVar4 / local_1598 + (double)uVar15 * dVar26 + rVar3 + rVar3;
    arma::Mat<double>::~Mat((Mat<double> *)&local_f38);
  }
  if (grad_out != (vec *)0x0) {
    uVar1 = (this->m_X).n_cols;
    tVar8 = Bench::tic();
    arma::Col<double>::Col((Col<double> *)(local_978 + 0xb0),uVar1);
    if ((local_518.mem == (double *)0x0) ||
       (local_518._0_8_ != CONCAT44(uStack_5c4,local_678._176_4_))) {
      arma::Mat<double>::Mat<arma::fill::fill_eye>
                ((Mat<double> *)local_1528,in_n_rows,in_n_rows,
                 (fill_class<arma::fill::fill_eye> *)&arma::fill::eye);
      LinearAlgebra::solve((mat *)&local_f38,(mat *)(local_678 + 0xb0),(mat *)local_1528);
      arma::Mat<double>::operator=((Mat<double> *)&local_518,(Mat<double> *)&local_f38);
      arma::Mat<double>::~Mat((Mat<double> *)&local_f38);
      arma::Mat<double>::~Mat((Mat<double> *)local_1528);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1288,"L ^-1",(allocator<char> *)&local_f38);
      tVar8 = Bench::toc(bench,&local_1288,tVar8);
      std::__cxx11::string::~string((string *)&local_1288);
    }
    LinearAlgebra::crossprod((mat *)local_978,(mat *)&local_518);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12a8,"R^-1 = t(L^-1) * L^-1",(allocator<char> *)&local_f38);
    tVar8 = Bench::toc(bench,&local_12a8,tVar8);
    std::__cxx11::string::~string((string *)&local_12a8);
    local_1528 = (undefined1  [8])(local_678 + 0xb0);
    arma::Mat<double>::Mat<arma::Mat<double>,arma::op_htrans>
              ((Mat<double> *)&local_f38,(Op<arma::Mat<double>,_arma::op_htrans> *)local_1528);
    LinearAlgebra::solve(&local_ad8,(mat *)&local_f38,&local_1a8);
    arma::Mat<double>::~Mat((Mat<double> *)&local_f38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12c8,"x = tL \\ z",(allocator<char> *)&local_f38);
    tVar8 = Bench::toc(bench,&local_12c8,tVar8);
    std::__cxx11::string::~string((string *)&local_12c8);
    arma::Cube<double>::Cube<arma::fill::fill_none>
              ((Cube<double> *)&local_f38,in_n_rows,in_n_rows,uVar1,
               (fill_class<arma::fill::fill_none> *)&arma::fill::none);
    arma::Col<double>::Col<arma::fill::fill_zeros>
              ((Col<double> *)&local_728,uVar1,
               (fill_class<arma::fill::fill_zeros> *)&arma::fill::zeros);
    iVar7 = 0;
    for (uVar23 = 0; uVar23 != in_n_rows; uVar23 = uVar23 + 1) {
      arma::arma_check_bounds<char[36]>
                (local_f38._4_4_ <= uVar23 || (uint)local_f38 <= uVar23,
                 (char (*) [36])"Cube::tube(): indices out of bounds");
      local_1528 = (undefined1  [8])&local_f38;
      local_1520 = (Mat<double> *)CONCAT44(uVar23,uVar23);
      local_1518 = 2.12199579096527e-314;
      uStack_1510 = 0x100000001;
      local_1508 = local_f2c;
      uStack_1504 = local_f2c;
      arma::subview_cube<double>::operator=
                ((subview_cube<double> *)local_1528,(Base<double,_arma::Mat<double>_> *)&local_728);
      for (uVar13 = 0; uVar23 != uVar13; uVar13 = uVar13 + 1) {
        dVar26 = *(double *)(local_678._32_8_ + (ulong)(local_678._0_4_ * uVar13 + uVar23) * 8);
        uVar14 = iVar7 + uVar13;
        arma::arma_check_bounds<char[32]>
                  ((this->m_dX).n_cols <= uVar14,(char (*) [32])"Mat::col(): index out of bounds");
        local_1238 = (this->m_dX).n_rows;
        local_1248._8_8_ = (ulong)uVar14 << 0x20;
        local_1234 = 1;
        local_1228 = (this->m_dX).mem + local_1238 * uVar14;
        local_1248._0_8_ = &this->m_dX;
        local_1230 = local_1238;
        arma::Col<double>::Col<arma::subview<double>>
                  ((Col<double> *)local_1448,(Base<double,_arma::subview<double>_> *)local_1248);
        std::function<arma::Col<double>_(const_arma::Col<double>_&,_const_arma::Col<double>_&)>::
        operator()((Col<double> *)local_1528,&this->_DlnCovDtheta,(Col<double> *)local_1448,_theta);
        local_10e8._0_8_ = (Mat<double> *)local_1528;
        local_10e8._16_8_ = dVar26;
        arma::arma_check_bounds<char[36]>
                  (local_f38._4_4_ <= uVar13 || (uint)local_f38 <= uVar23,
                   (char (*) [36])"Cube::tube(): indices out of bounds");
        local_1198._16_8_ = 2.12199579096527e-314;
        dStack_1180 = 2.12199579145934e-314;
        local_1178 = local_f2c;
        uStack_1174 = local_f2c;
        local_1198._0_8_ = (Cube<double> *)&local_f38;
        local_1198._8_4_ = uVar23;
        local_1198._12_4_ = uVar13;
        arma::subview_cube<double>::operator=
                  ((subview_cube<double> *)local_1198,
                   (Base<double,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>_> *)local_10e8
                  );
        arma::Mat<double>::~Mat((Mat<double> *)local_1528);
        arma::Mat<double>::~Mat((Mat<double> *)local_1448);
        arma::arma_check_bounds<char[36]>
                  (local_f38._4_4_ <= uVar13 || (uint)local_f38 <= uVar23,
                   (char (*) [36])"Cube::tube(): indices out of bounds");
        local_1520 = (Mat<double> *)CONCAT44(uVar13,uVar23);
        local_1518 = 2.12199579096527e-314;
        uStack_1510 = 0x100000001;
        local_1508 = local_f2c;
        uStack_1504 = local_f2c;
        local_1528 = (undefined1  [8])&local_f38;
        arma::arma_check_bounds<char[36]>
                  (local_f38._4_4_ <= uVar23 || (uint)local_f38 <= uVar13,
                   (char (*) [36])"Cube::tube(): indices out of bounds");
        local_1440 = (mat *)CONCAT44(uVar23,uVar13);
        local_1438._0_4_ = 0;
        local_1438._4_4_ = 1;
        uStack_1430._0_4_ = 1;
        uStack_1430._4_4_ = 1;
        local_1428 = local_f2c;
        uStack_1424 = local_f2c;
        local_1448 = (undefined1  [8])&local_f38;
        arma::subview_cube<double>::operator=
                  ((subview_cube<double> *)local_1448,(subview_cube<double> *)local_1528);
      }
      iVar7 = iVar7 + in_n_rows;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12e8,"gradR = R * dlnCov(dX)",(allocator<char> *)local_1528);
    Bench::toc(bench,&local_12e8,tVar8);
    std::__cxx11::string::~string((string *)&local_12e8);
    local_1530 = (double)uVar15;
    for (uVar10 = 0; uVar10 != uVar1; uVar10 = uVar10 + 1) {
      tVar8 = Bench::tic();
      in_slice = (uword)uVar10;
      pMVar9 = arma::Cube<double>::slice((Cube<double> *)&local_f38,in_slice);
      arma::Mat<double>::Mat((Mat<double> *)local_10e8,pMVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f58,"gradR_k = gradR[k]",(allocator<char> *)local_1528);
      tVar8 = Bench::toc(bench,&local_f58,tVar8);
      std::__cxx11::string::~string((string *)&local_f58);
      local_1528 = (undefined1  [8])&local_ad8;
      local_1448 = (undefined1  [8])local_1248;
      local_1440 = (mat *)local_1528;
      local_1248._0_8_ = (Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *)local_1528;
      local_1248._8_8_ = (Mat<double> *)local_10e8;
      eVar5 = arma::as_scalar_redirect<3u>::
              apply<arma::Op<arma::Mat<double>,arma::op_htrans>,arma::Mat<double>,arma::Mat<double>>
                        ((Glue<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                          *)local_1448);
      *(double *)((long)local_8a8 + uVar10 * 8) = eVar5 / local_1598;
      local_1528 = (undefined1  [8])local_978;
      local_1520 = (Mat<double> *)local_10e8;
      rVar3 = arma::trace<arma::Mat<double>,arma::Mat<double>>
                        ((Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *)local_1528)
      ;
      (grad_out->super_Mat<double>).mem[uVar10] =
           (*(double *)((long)local_8a8 + uVar10 * 8) - rVar3) * 0.5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f78,"grad_ll[k] = xt * gradR_k / S2 + tr(Ri * gradR_k)",
                 (allocator<char> *)local_1528);
      Bench::toc(bench,&local_f78,tVar8);
      std::__cxx11::string::~string((string *)&local_f78);
      if (hess_out != (mat *)0x0) {
        tVar8 = Bench::tic();
        LinearAlgebra::tcrossprod((mat *)local_1248,&local_258);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f98,"H =  Q* * t(Q*)",(allocator<char> *)local_1528);
        Bench::toc(bench,&local_f98,tVar8);
        std::__cxx11::string::~string((string *)&local_f98);
        uVar23 = 0;
        while( true ) {
          uVar17 = (ulong)uVar23;
          if (uVar10 < uVar17) break;
          pMVar9 = arma::Cube<double>::slice((Cube<double> *)&local_f38,uVar23);
          arma::Mat<double>::Mat((Mat<double> *)local_1198,pMVar9);
          tVar8 = Bench::tic();
          local_1440 = (mat *)local_978;
          local_1528 = (undefined1  [8])local_1448;
          local_1520 = (Mat<double> *)local_1198;
          local_1448 = (undefined1  [8])local_10e8;
          arma::Mat<double>::
          Mat<arma::Glue<arma::Mat<double>,arma::Mat<double>,arma::glue_times>,arma::Mat<double>,arma::glue_times>
                    (&local_a28,
                     (Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                      *)local_1528);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_fb8,"aux =  gradR[k] * Ri * gradR[l]",
                     (allocator<char> *)local_1528);
          tVar8 = Bench::toc(bench,&local_fb8,tVar8);
          std::__cxx11::string::~string((string *)&local_fb8);
          arma::Mat<double>::Mat<arma::fill::fill_none>
                    (&local_cb8,in_n_rows,in_n_rows,
                     (fill_class<arma::fill::fill_none> *)&arma::fill::none);
          if (uVar10 == uVar17) {
            uVar13 = 0;
            for (uVar18 = 0; uVar18 != uVar15; uVar18 = uVar18 + 1) {
              local_cb8.mem[local_cb8.n_rows * (int)uVar18 + (int)uVar18] = 0.0;
              pdVar2 = (_theta->super_Mat<double>).mem;
              uVar19 = uVar18 & 0xffffffff;
              uVar12 = uVar18 & 0xffffffff;
              uVar21 = uVar18 & 0xffffffff;
              uVar20 = uVar18;
              uVar14 = uVar13;
              while( true ) {
                bVar25 = uVar20 == 0;
                uVar20 = uVar20 - 1;
                if (bVar25) break;
                dVar26 = (local_10c8[uVar19] / *(double *)(local_678._32_8_ + uVar12 * 8) -
                         (this->_Cov_pow + 1.0) / pdVar2[uVar10]) * local_10c8[uVar19];
                local_cb8.mem[uVar14] = dVar26;
                local_cb8.mem[uVar21] = dVar26;
                uVar21 = (ulong)((int)uVar21 + local_cb8.n_rows);
                uVar14 = uVar14 + 1;
                uVar12 = (ulong)(uint)((int)uVar12 + local_678._0_4_);
                uVar19 = (ulong)(uint)((int)uVar19 + local_10e8._0_4_);
              }
              uVar13 = uVar13 + local_cb8.n_rows;
            }
          }
          else {
            uVar20 = 0;
            for (uVar18 = 0; uVar18 != uVar15; uVar18 = uVar18 + 1) {
              local_cb8.mem[local_cb8.n_rows * (int)uVar18 + (int)uVar18] = 0.0;
              uVar24 = uVar18 & 0xffffffff;
              uVar16 = uVar18 & 0xffffffff;
              uVar22 = uVar18 & 0xffffffff;
              uVar12 = uVar18 & 0xffffffff;
              uVar19 = uVar18;
              uVar21 = uVar20;
              while (bVar25 = uVar19 != 0, uVar19 = uVar19 - 1, bVar25) {
                dVar26 = (local_10c8[uVar24] *
                         *(double *)(CONCAT44(uStack_1174,local_1178) + uVar16 * 8)) /
                         *(double *)(local_678._32_8_ + uVar22 * 8);
                local_cb8.mem[uVar21] = dVar26;
                local_cb8.mem[uVar12] = dVar26;
                uVar12 = (ulong)((int)uVar12 + local_cb8.n_rows);
                uVar21 = (ulong)((int)uVar21 + 1);
                uVar22 = (ulong)(uint)((int)uVar22 + local_678._0_4_);
                uVar16 = (ulong)(uint)((int)uVar16 + local_1198._0_4_);
                uVar24 = (ulong)(uint)((int)uVar24 + local_10e8._0_4_);
              }
              uVar20 = (ulong)((int)uVar20 + local_cb8.n_rows);
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_fd8,"hessR_k_l = ...",(allocator<char> *)local_1528);
          tVar8 = Bench::toc(bench,&local_fd8,tVar8);
          std::__cxx11::string::~string((string *)&local_fd8);
          local_1448 = (undefined1  [8])&local_518;
          local_1528 = (undefined1  [8])local_1448;
          local_1520 = &local_ad8;
          local_1440 = (mat *)local_10e8;
          arma::Mat<double>::
          Mat<arma::Glue<arma::Mat<double>,arma::Mat<double>,arma::glue_times>,arma::Mat<double>,arma::glue_times>
                    (&local_7d8,
                     (Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                      *)local_1528);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ff8,"xk = L \\ gradR[k] * x",(allocator<char> *)local_1528);
          tVar8 = Bench::toc(bench,&local_ff8,tVar8);
          std::__cxx11::string::~string((string *)&local_ff8);
          local_b88.mem = (double *)0x0;
          local_b88.vec_state = 0;
          local_b88.mem_state = 0;
          local_b88.n_rows = 0;
          local_b88.n_cols = 0;
          local_b88.n_elem = 0;
          local_b88.n_alloc = 0;
          if (uVar10 == uVar17) {
            arma::Mat<double>::operator=(&local_b88,&local_7d8);
          }
          else {
            local_1448 = (undefined1  [8])&local_518;
            local_1440 = (mat *)local_1198;
            local_1528 = (undefined1  [8])local_1448;
            local_1520 = &local_ad8;
            arma::glue_times_redirect3_helper<false>::
            apply<arma::Mat<double>,arma::Mat<double>,arma::Mat<double>>
                      (&local_b88,
                       (Glue<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                        *)local_1528);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1018,"xl = L \\ gradR[l] * x",(allocator<char> *)local_1528);
          tVar8 = Bench::toc(bench,&local_1018,tVar8);
          std::__cxx11::string::~string((string *)&local_1018);
          local_bc8.m = &local_7d8;
          local_bc8.aux = 2.0;
          local_1318.A = &local_bc8;
          local_1318.B = (Mat<double> *)local_1248;
          local_1300.A = &local_1318;
          local_1300.B = &local_b88;
          arma::Mat<double>::
          Mat<arma::Glue<arma::Op<arma::Mat<double>,arma::op_htrans2>,arma::Mat<double>,arma::glue_times>,arma::Mat<double>,arma::glue_times>
                    ((Mat<double> *)local_1528,&local_1300);
          local_1478 = local_1598;
          local_818.m = &local_ad8;
          local_c08.P.Q = &local_a28;
          local_c08.aux = 2.0;
          local_1268.P1.Q = &local_cb8;
          local_1268.P2.Q = &local_c08;
          x_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)local_cb8.n_rows;
          if ((local_cb8.n_rows != local_a28.n_rows) || (local_cb8.n_cols != local_a28.n_cols)) {
            uVar11 = local_a28.n_rows;
            B_n_rows = local_a28.n_cols;
            arma::arma_incompat_size_string_abi_cxx11_
                      (&local_1550,(arma *)x_00,local_cb8.n_cols,local_a28.n_rows,local_a28.n_cols,
                       0x1853b1,in_stack_ffffffffffffea38);
            arma::arma_stop_logic_error<std::__cxx11::string>((arma *)&local_1550,x_00);
            A_n_rows = extraout_EDX;
LAB_00132f91:
            arma::arma_incompat_size_string_abi_cxx11_
                      (&local_1550,(arma *)x_00,A_n_rows,uVar11,B_n_rows,0x18516f,
                       in_stack_ffffffffffffea38);
            arma::arma_stop_logic_error<std::__cxx11::string>((arma *)&local_1550,x_00);
            std::__cxx11::string::~string((string *)&local_1288);
            arma::Mat<double>::~Mat((Mat<double> *)(local_978 + 0xb0));
            KModel::~KModel((KModel *)local_678);
            _Unwind_Resume(extraout_RAX);
          }
          local_1348.A = &local_818;
          local_1348.B = &local_1268;
          local_1330.A = &local_1348;
          local_1330.B = &local_ad8;
          arma::Mat<double>::
          Mat<arma::Glue<arma::Op<arma::Mat<double>,arma::op_htrans>,arma::eGlue<arma::Mat<double>,arma::eOp<arma::Mat<double>,arma::eop_scalar_times>,arma::eglue_minus>,arma::glue_times>,arma::Mat<double>,arma::glue_times>
                    ((Mat<double> *)local_1448,&local_1330);
          local_1398 = local_1598;
          x_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)local_1528 & 0xffffffff);
          uVar11 = local_1448._0_4_;
          A_n_rows = local_1528._4_4_;
          B_n_rows = local_1448._4_4_;
          if ((local_1528._0_4_ != local_1448._0_4_) || (local_1528._4_4_ != local_1448._4_4_))
          goto LAB_00132f91;
          local_1550._M_string_length = (size_type)&local_a28;
          local_1550._M_dataplus._M_p = (pointer)local_978;
          rVar3 = arma::trace<arma::Mat<double>,arma::Mat<double>>
                            ((Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *)
                             &local_1550);
          local_1360.B = &local_cb8;
          local_1360.A = (Mat<double> *)local_978;
          rVar6 = arma::trace<arma::Mat<double>,arma::Mat<double>>(&local_1360);
          auVar27._8_8_ = *(undefined8 *)CONCAT44(uStack_1424,local_1428);
          auVar27._0_8_ = *(undefined8 *)CONCAT44(uStack_1504,local_1508);
          auVar28._8_8_ = local_1398;
          auVar28._0_8_ = local_1478;
          auVar28 = divpd(auVar27,auVar28);
          dVar26 = (rVar3 + auVar28._8_8_ + auVar28._0_8_) - rVar6;
          arma::Mat<double>::~Mat((Mat<double> *)local_1448);
          arma::Mat<double>::~Mat((Mat<double> *)local_1528);
          if (this->m_est_sigma2 == true) {
            dVar26 = dVar26 + (*(double *)((long)local_8a8 + uVar10 * 8) *
                              *(double *)((long)local_8a8 + uVar17 * 8)) / local_1530;
          }
          pdVar2 = hess_out->mem;
          uVar11 = hess_out->n_rows;
          pdVar2[uVar11 * uVar23 + in_slice] = dVar26 * 0.5;
          pdVar2[uVar11 * in_slice + uVar23] = dVar26 * 0.5;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1038,"hess_ll[l,k] = ...",(allocator<char> *)local_1528);
          Bench::toc(bench,&local_1038,tVar8);
          std::__cxx11::string::~string((string *)&local_1038);
          arma::Mat<double>::~Mat(&local_b88);
          arma::Mat<double>::~Mat(&local_7d8);
          arma::Mat<double>::~Mat(&local_cb8);
          arma::Mat<double>::~Mat(&local_a28);
          arma::Mat<double>::~Mat((Mat<double> *)local_1198);
          uVar23 = uVar23 + 1;
        }
        arma::Mat<double>::~Mat((Mat<double> *)local_1248);
      }
      arma::Mat<double>::~Mat((Mat<double> *)local_10e8);
    }
    arma::Mat<double>::~Mat(&local_728);
    arma::Cube<double>::~Cube((Cube<double> *)&local_f38);
    arma::Mat<double>::~Mat(&local_ad8);
    arma::Mat<double>::~Mat((Mat<double> *)local_978);
    arma::Mat<double>::~Mat((Mat<double> *)(local_978 + 0xb0));
  }
  KModel::~KModel((KModel *)local_678);
  return local_15a0 * -0.5;
}

Assistant:

double Kriging::_logLikelihood(const arma::vec& _theta,
                               arma::vec* grad_out,
                               arma::mat* hess_out,
                               Kriging::KModel* model,
                               std::map<std::string, double>* bench) const {
  // arma::cout << " theta: " << _theta << arma::endl;

  Kriging::KModel m = make_Model(_theta, bench);
  if (model != nullptr)
    *model = m;

  arma::uword n = m_X.n_rows;

  double sigma2;
  double ll;
  if (m_est_sigma2) {  // DiceKriging: model@case == "LLconcentration_beta_sigma2"
    sigma2 = m.SSEstar / n;
    ll = -0.5 * (n * log(2 * M_PI * sigma2) + 2 * arma::sum(log(m.L.diag())) + n);
  } else {  // DiceKriging: model@case == "LLconcentration_beta"
    sigma2 = m_sigma2;
    ll = -0.5
         * (n * log(2 * M_PI * sigma2) + 2 * arma::sum(log(m.L.diag()))
            + as_scalar(LinearAlgebra::crossprod(m.Estar)) / sigma2);
  }

  if (grad_out != nullptr) {
    arma::uword d = m_X.n_cols;
    arma::uword p = m_F.n_cols;

    auto t0 = Bench::tic();
    arma::vec terme1 = arma::vec(d);  // useful if (hess_out != nullptr)

    if ((m.Linv.memptr() == nullptr) || (arma::size(m.Linv) != arma::size(m.L))) {
      m.Linv = LinearAlgebra::solve(m.L, arma::mat(n, n, arma::fill::eye));
      t0 = Bench::toc(bench, "L ^-1", t0);
    }

    arma::mat Rinv = LinearAlgebra::crossprod(m.Linv);
    t0 = Bench::toc(bench, "R^-1 = t(L^-1) * L^-1", t0);

    arma::mat x = LinearAlgebra::solve(m.L.t(), m.Estar);
    t0 = Bench::toc(bench, "x = tL \\ z", t0);

    arma::cube gradR = arma::cube(n, n, d, arma::fill::none);
    const arma::vec zeros = arma::vec(d, arma::fill::zeros);
    for (arma::uword i = 0; i < n; i++) {
      gradR.tube(i, i) = zeros;
      for (arma::uword j = 0; j < i; j++) {
        gradR.tube(i, j) = m.R.at(i, j) * _DlnCovDtheta(m_dX.col(i * n + j), _theta);
        gradR.tube(j, i) = gradR.tube(i, j);
      }
    }
    t0 = Bench::toc(bench, "gradR = R * dlnCov(dX)", t0);

    for (arma::uword k = 0; k < d; k++) {
      t0 = Bench::tic();
      arma::mat gradR_k = gradR.slice(k);
      t0 = Bench::toc(bench, "gradR_k = gradR[k]", t0);

      // should make a fast function trace_prod(A,B) -> sum_i(sum_j(Ai,j*Bj,i))
      terme1.at(k) = as_scalar(x.t() * gradR_k * x) / sigma2;
      double terme2 = -arma::trace(Rinv * gradR_k);  //-arma::accu(Rinv % gradR_k_upper)
      (*grad_out).at(k) = (terme1.at(k) + terme2) / 2;
      t0 = Bench::toc(bench, "grad_ll[k] = xt * gradR_k / S2 + tr(Ri * gradR_k)", t0);

      if (hess_out != nullptr) {
        //' @ref O. Roustant
        // for (k in 1:d) {
        //   for (l in 1:k) {
        //     aux <- grad_R[[k]] %*% Rinv %*% grad_R[[l]]
        //     Dkl <- d2_matcor(X, modele_proba$covariance, R, grad_logR, k,l)
        //     xk <- backsolve(t(T),grad_R[[k]]%*%x, upper.tri=FALSE)
        //     xl <- backsolve(t(T),grad_R[[l]]%*%x, upper.tri=FALSE)
        //
        //     hess_A <- - (t(xk) %*% H %*% xl) / sigma2_hat
        //     hess_B <- (t(x) %*% ( -Dkl+2*aux ) %*% x) / sigma2_hat
        //     hess_C <- - grad_A[k] * grad_A[l] / n
        //     hess_D <- - sum(diag( Rinv %*% aux ))
        //     hess_E <- sum(diag( Rinv %*% Dkl ))
        //
        //     hess_log_vrais[k,l] <- 2*hess_A + hess_B + hess_C + hess_D + hess_E
        //     hess_log_vrais[l,k] <- hess_log_vrais[k,l]
        //   }
        // }
        t0 = Bench::tic();
        arma::mat H = LinearAlgebra::tcrossprod(m.Qstar);
        t0 = Bench::toc(bench, "H =  Q* * t(Q*)", t0);

        for (arma::uword l = 0; l <= k; l++) {
          arma::mat gradR_l = gradR.slice(l);  // arma::mat(n, n);

          t0 = Bench::tic();
          arma::mat aux = gradR_k * Rinv * gradR_l;
          t0 = Bench::toc(bench, "aux =  gradR[k] * Ri * gradR[l]", t0);

          arma::mat hessR_k_l = arma::mat(n, n, arma::fill::none);
          if (k == l) {
            for (arma::uword i = 0; i < n; i++) {
              hessR_k_l.at(i, i) = 0;
              for (arma::uword j = 0; j < i; j++) {
                double dln_k = gradR_k.at(i, j);
                hessR_k_l.at(i, j) = hessR_k_l.at(j, i)
                    = dln_k * (dln_k / m.R.at(i, j) - (_Cov_pow + 1) / _theta.at(k));
                // !! NO: it just work for exp type kernels. Matern MUST have a special treatment !!!
              }
            }
          } else {
            for (arma::uword i = 0; i < n; i++) {
              hessR_k_l.at(i, i) = 0;
              for (arma::uword j = 0; j < i; j++) {
                hessR_k_l.at(i, j) = hessR_k_l.at(j, i) = gradR_k.at(i, j) * gradR_l.at(i, j) / m.R.at(i, j);
                //= gradR.slice(i).col(j)[k] * gradR.slice(i).col(j)[l] / m.R.at(i, j);
              }
            }
          }
          t0 = Bench::toc(bench, "hessR_k_l = ...", t0);

          // arma::mat xk =LinearAlgebra::solve(m.T, gradsR[k] * x);
          arma::mat xk = m.Linv * gradR_k * x;
          t0 = Bench::toc(bench, "xk = L \\ gradR[k] * x", t0);
          arma::mat xl;
          if (k == l)
            xl = xk;
          else
            xl = m.Linv * gradR_l * x;
          t0 = Bench::toc(bench, "xl = L \\ gradR[l] * x", t0);

          // arma::cout << " hess_A:" << -xk.t() * H * xl / sigma2 << arma::endl;
          // arma::cout << " hess_B:" << -x.t() * (hessR_k_l - 2*aux) * x / sigma2 << arma::endl;
          // arma::cout << " hess_C:" << -terme1.at(k) * terme1.at(l) / n << arma::endl;
          // arma::cout << " hess_D:" << -arma::trace(Rinv * aux)  << arma::endl;
          // arma::cout << " hess_E:" << arma::trace(Rinv * hessR_k_l) << arma::endl;

          double h_lk
              = (2.0 * xk.t() * H * xl / (sigma2) + x.t() * (hessR_k_l - 2 * aux) * x / (sigma2)
                 + arma::trace(Rinv * aux) + -arma::trace(Rinv * hessR_k_l))[0];  // should optim there using accu  &%
          if (m_est_sigma2)
            h_lk += terme1.at(k) * terme1.at(l) / n;

          (*hess_out).at(l, k) = (*hess_out).at(k, l) = h_lk / 2;
          t0 = Bench::toc(bench, "hess_ll[l,k] = ...", t0);
        }
      }
    }
  }
  return ll;
}